

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O0

void __thiscall
kratos::SensitivityVisitor::visit(SensitivityVisitor *this,SequentialStmtBlock *stmt)

{
  allocator<kratos::IRNode_*> *this_00;
  initializer_list<kratos::IRNode_*> __l;
  initializer_list<kratos::IRNode_*> __l_00;
  initializer_list<kratos::IRNode_*> __l_01;
  bool bVar1;
  VarType VVar2;
  PortType PVar3;
  VarCastType VVar4;
  vector<kratos::EventControl,_std::allocator<kratos::EventControl>_> *this_01;
  reference pEVar5;
  element_type *peVar6;
  StmtException *pSVar7;
  element_type *peVar8;
  remove_reference_t<std::__cxx11::basic_string<char>_> *in_RCX;
  PortType type;
  char (*format_str) [86];
  char (*format_str_00) [80];
  remove_reference_t<std::__cxx11::basic_string<char>_> *in_R8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  format_args args;
  format_args args_00;
  format_args args_01;
  string_view format_str_01;
  string_view format_str_02;
  string_view format_str_03;
  allocator<kratos::IRNode_*> local_3a1;
  SequentialStmtBlock *local_3a0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_398;
  SequentialStmtBlock **local_390;
  size_type local_388;
  vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> local_380;
  v7 local_368 [32];
  string local_348;
  undefined1 local_322;
  allocator<kratos::IRNode_*> local_321;
  SequentialStmtBlock *local_320;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_318;
  SequentialStmtBlock **local_310;
  size_type local_308;
  vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> local_300;
  v7 local_2e8 [32];
  undefined1 local_2c8 [32];
  undefined1 local_2a8 [8];
  shared_ptr<kratos::VarCasted> var_casted;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_290;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  *local_280;
  pointer local_278;
  vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> local_270;
  string local_258;
  shared_ptr<kratos::VarConcat> local_228 [2];
  string local_208;
  undefined1 local_1e8 [8];
  shared_ptr<kratos::Port> port;
  Var *var;
  EventControl *iter;
  const_iterator __end2;
  const_iterator __begin2;
  vector<kratos::EventControl,_std::allocator<kratos::EventControl>_> *__range2;
  vector<kratos::EventControl,_std::allocator<kratos::EventControl>_> *sensitivity_list;
  SequentialStmtBlock *stmt_local;
  SensitivityVisitor *this_local;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  local_190;
  basic_string_view<char> local_188;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_178;
  undefined8 local_158;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs;
  shared_ptr<kratos::VarConcat> *local_148;
  pointer local_140;
  string *local_138;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_130;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_128;
  __node_base local_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_118;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_f8;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  local_e8 [2];
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs_1;
  Var *local_c0;
  Param *local_b8;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_b0;
  __node_base local_a8;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_a0;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_98;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_90;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_88;
  basic_string_view<char> local_78;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  local_68;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_50;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs_2;
  char *local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_38;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_28;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_20;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_18;
  
  this_01 = SequentialStmtBlock::get_event_controls(stmt);
  __end2 = std::vector<kratos::EventControl,_std::allocator<kratos::EventControl>_>::begin(this_01);
  iter = (EventControl *)
         std::vector<kratos::EventControl,_std::allocator<kratos::EventControl>_>::end(this_01);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_kratos::EventControl_*,_std::vector<kratos::EventControl,_std::allocator<kratos::EventControl>_>_>
                                *)&iter);
    if (!bVar1) {
      return;
    }
    pEVar5 = __gnu_cxx::
             __normal_iterator<const_kratos::EventControl_*,_std::vector<kratos::EventControl,_std::allocator<kratos::EventControl>_>_>
             ::operator*(&__end2);
    port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pEVar5->var;
    VVar2 = Var::type((Var *)port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi);
    if (VVar2 == PortIO) {
      Var::as<kratos::Port>((Var *)local_1e8);
      peVar6 = std::__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_1e8);
      PVar3 = Port::port_type(peVar6);
      if (PVar3 != Clock) {
        peVar6 = std::__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_1e8);
        PVar3 = Port::port_type(peVar6);
        if (PVar3 != AsyncReset) {
          var_casted.super___shared_ptr<kratos::VarCasted,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi._6_1_ = 1;
          pSVar7 = (StmtException *)__cxa_allocate_exception(0x10);
          (*(port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _vptr__Sp_counted_base[0x1f])(local_228);
          peVar6 = std::__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_1e8);
          PVar3 = Port::port_type(peVar6);
          port_type_to_str_abi_cxx11_(&local_258,(kratos *)(ulong)PVar3,type);
          local_138 = &local_208;
          local_140 = (pointer)0x456395;
          local_148 = local_228;
          vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_258;
          fmt::v7::make_args_checked<std::__cxx11::string,std::__cxx11::string,char[66],char>
                    (&local_178,
                     (v7 *)"Only Clock and AsyncReset allowed in sensitivity list. {0} is {1}",
                     (char (*) [66])local_148,
                     (remove_reference_t<std::__cxx11::basic_string<char>_> *)vargs,in_R8);
          local_158 = &local_178;
          local_188 = fmt::v7::to_string_view<char,_0>((char *)local_140);
          local_128 = (basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                       *)&this_local;
          local_130 = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_158;
          local_120._M_nxt = (_Hash_node_base *)local_158;
          local_118._8_8_ = local_158;
          local_118._M_allocated_capacity = (size_type)local_128;
          fmt::v7::
          basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          ::basic_format_args(local_128,0xdd,
                              (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                               *)local_158);
          args.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .field_1.values_ = in_R9.values_;
          args.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .desc_ = (unsigned_long_long)local_190.values_;
          format_str_01.size_ = (size_t)this_local;
          format_str_01.data_ = (char *)local_188.size_;
          fmt::v7::detail::vformat_abi_cxx11_
                    (&local_208,(detail *)local_188.data_,format_str_01,args);
          local_290._8_8_ =
               port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
          local_280 = &local_290;
          local_278 = (pointer)0x2;
          this_00 = (allocator<kratos::IRNode_*> *)
                    ((long)&var_casted.
                            super___shared_ptr<kratos::VarCasted,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi + 7);
          local_290._M_allocated_capacity = (size_type)stmt;
          std::allocator<kratos::IRNode_*>::allocator(this_00);
          __l_01._M_len = (size_type)local_278;
          __l_01._M_array = (iterator)local_280;
          std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector
                    (&local_270,__l_01,this_00);
          StmtException::StmtException(pSVar7,&local_208,&local_270);
          var_casted.super___shared_ptr<kratos::VarCasted,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi._6_1_ = 0;
          __cxa_throw(pSVar7,&StmtException::typeinfo,StmtException::~StmtException);
        }
      }
      std::shared_ptr<kratos::Port>::~shared_ptr((shared_ptr<kratos::Port> *)local_1e8);
    }
    else {
      VVar2 = Var::type((Var *)port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi);
      if (VVar2 != BaseCasted) {
        pSVar7 = (StmtException *)__cxa_allocate_exception(0x10);
        (*(port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _vptr__Sp_counted_base[0x1f])(local_368);
        local_38._M_allocated_capacity = (size_type)&local_348;
        local_40 = "Only variable type of Clock and AsyncReset allowed in sensitivity list, got {0}"
        ;
        vargs_2 = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_368;
        local_68.named_args.data =
             (named_arg_info<char> *)
             fmt::v7::make_args_checked<std::__cxx11::string,char[80],char>
                       ((format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)
                        "Only variable type of Clock and AsyncReset allowed in sensitivity list, got {0}"
                        ,(v7 *)vargs_2,format_str_00,in_RCX);
        local_50 = &local_68;
        local_78 = fmt::v7::to_string_view<char,_0>(local_40);
        local_28 = &local_88;
        local_38._8_8_ = local_50;
        local_20 = local_50;
        local_18._8_8_ = local_50;
        local_18._M_allocated_capacity = (size_type)local_28;
        fmt::v7::
        basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        ::basic_format_args(local_28,0xd,
                            (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                             *)&local_50->string);
        args_01.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .field_1.values_ = in_R9.values_;
        args_01.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .desc_ = (unsigned_long_long)local_88.field_1.values_;
        format_str_03.size_ = local_88.desc_;
        format_str_03.data_ = (char *)local_78.size_;
        fmt::v7::detail::vformat_abi_cxx11_
                  (&local_348,(detail *)local_78.data_,format_str_03,args_01);
        local_398 = port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi;
        local_390 = &local_3a0;
        local_388 = 2;
        local_3a0 = stmt;
        std::allocator<kratos::IRNode_*>::allocator(&local_3a1);
        __l._M_len = local_388;
        __l._M_array = (iterator)local_390;
        std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector
                  (&local_380,__l,&local_3a1);
        StmtException::StmtException(pSVar7,&local_348,&local_380);
        __cxa_throw(pSVar7,&StmtException::typeinfo,StmtException::~StmtException);
      }
      Var::as<kratos::VarCasted>((Var *)local_2a8);
      peVar8 = std::__shared_ptr_access<kratos::VarCasted,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<kratos::VarCasted,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_2a8);
      VVar4 = VarCasted::cast_type(peVar8);
      if (VVar4 != Clock) {
        peVar8 = std::
                 __shared_ptr_access<kratos::VarCasted,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<kratos::VarCasted,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_2a8);
        VVar4 = VarCasted::cast_type(peVar8);
        if (VVar4 != AsyncReset) {
          local_322 = 1;
          pSVar7 = (StmtException *)__cxa_allocate_exception(0x10);
          (*(port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _vptr__Sp_counted_base[0x1f])(local_2e8);
          local_b8 = (Param *)local_2c8;
          local_c0 = (Var *)0x4563d7;
          vargs_1 = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)local_2e8;
          local_e8[0]._0_8_ =
               fmt::v7::make_args_checked<std::__cxx11::string,char[86],char>
                         ((format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)
                          "Only Clock and AsyncReset allowed in sensitivity list. Please use cast() to cast {0}}"
                          ,(v7 *)vargs_1,format_str,in_RCX);
          local_e8[1]._8_8_ = local_e8;
          local_f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
                      )fmt::v7::to_string_view<char,_0>((char *)local_c0);
          local_a8._M_nxt = (_Hash_node_base *)&local_108;
          local_b0 = (anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
                      *)local_e8[1]._8_8_;
          local_a0 = (anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
                      *)local_e8[1]._8_8_;
          local_90 = (anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
                      *)local_e8[1]._8_8_;
          local_98 = (basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                      *)local_a8._M_nxt;
          fmt::v7::
          basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          ::basic_format_args((basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                               *)local_a8._M_nxt,0xd,
                              (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                               *)local_e8[1]._8_8_);
          args_00.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .field_1.values_ = in_R9.values_;
          args_00.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .desc_ = (unsigned_long_long)local_108.field_1.values_;
          format_str_02.size_ = local_108.desc_;
          format_str_02.data_ = (char *)local_f8._8_8_;
          fmt::v7::detail::vformat_abi_cxx11_
                    ((string *)local_2c8,(detail *)local_f8._M_allocated_capacity,format_str_02,
                     args_00);
          local_318 = port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                      _M_pi;
          local_310 = &local_320;
          local_308 = 2;
          local_320 = stmt;
          std::allocator<kratos::IRNode_*>::allocator(&local_321);
          __l_00._M_len = local_308;
          __l_00._M_array = (iterator)local_310;
          std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector
                    (&local_300,__l_00,&local_321);
          StmtException::StmtException(pSVar7,(string *)local_2c8,&local_300);
          local_322 = 0;
          __cxa_throw(pSVar7,&StmtException::typeinfo,StmtException::~StmtException);
        }
      }
      std::shared_ptr<kratos::VarCasted>::~shared_ptr((shared_ptr<kratos::VarCasted> *)local_2a8);
    }
    __gnu_cxx::
    __normal_iterator<const_kratos::EventControl_*,_std::vector<kratos::EventControl,_std::allocator<kratos::EventControl>_>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

void visit(SequentialStmtBlock* stmt) override {
        auto const& sensitivity_list = stmt->get_event_controls();
        for (auto const& iter : sensitivity_list) {
            auto* var = iter.var;
            // check type
            if (var->type() == VarType::PortIO) {
                // it's a port
                auto port = var->as<Port>();
                if (port->port_type() != PortType::Clock &&
                    port->port_type() != PortType::AsyncReset) {
                    // only clock and async reset allowed
                    throw StmtException(
                        ::format("Only Clock and AsyncReset allowed in "
                                 "sensitivity list. {0} is {1}",
                                 var->to_string(), port_type_to_str(port->port_type())),
                        {stmt, var});
                }
            } else if (var->type() == VarType::BaseCasted) {
                auto var_casted = var->as<VarCasted>();
                if (var_casted->cast_type() != VarCastType::Clock &&
                    var_casted->cast_type() != VarCastType::AsyncReset) {
                    throw StmtException(::format("Only Clock and AsyncReset allowed in "
                                                 "sensitivity list. Please use cast() to cast {0}}",
                                                 var->to_string()),
                                        {stmt, var});
                }
            } else {
                throw StmtException(::format("Only variable type of Clock and "
                                             "AsyncReset allowed in sensitivity list, got {0}",
                                             var->to_string()),
                                    {stmt, var});
            }
        }
    }